

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qwidgettextcontrol_p.cpp
# Opt level: O3

void QWidgetTextControl::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  uint uVar1;
  int *piVar2;
  QArrayData *pQVar3;
  void **ppvVar4;
  undefined1 *puVar5;
  code *pcVar6;
  long lVar7;
  undefined1 uVar8;
  int iVar9;
  anon_union_24_3_e3d07ef4_for_data *paVar10;
  anon_union_24_3_e3d07ef4_for_data *paVar11;
  anon_union_24_3_e3d07ef4_for_data *paVar12;
  undefined4 in_register_00000014;
  QString *pQVar13;
  TextFormat TVar14;
  Mode mode;
  undefined4 in_register_00000034;
  QWidgetTextControlPrivate *pQVar15;
  long in_FS_OFFSET;
  anon_union_24_3_e3d07ef4_for_data local_48;
  undefined1 *puStack_30;
  void *local_28 [2];
  long local_18;
  
  paVar10 = &local_48;
  paVar11 = &local_48;
  paVar12 = &local_48;
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  switch(_c) {
  case InvokeMetaMethod:
    break;
  case ReadProperty:
    if (6 < (uint)_id) goto switchD_004c9d5a_caseD_3;
    piVar2 = (int *)*_a;
    switch(_id) {
    case 0:
      QTextDocument::toHtml();
      pQVar3 = *(QArrayData **)piVar2;
      *(PrivateShared **)piVar2 = local_48.shared;
      ppvVar4 = *(void ***)(piVar2 + 2);
      *(undefined8 *)(piVar2 + 2) = local_48._8_8_;
      puVar5 = *(undefined1 **)(piVar2 + 4);
      *(undefined8 *)(piVar2 + 4) = local_48._16_8_;
      local_48.shared = (PrivateShared *)pQVar3;
      local_48._8_8_ = ppvVar4;
      local_48._16_8_ = puVar5;
      if (pQVar3 != (QArrayData *)0x0) {
        LOCK();
        (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i =
             (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((pQVar3->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(pQVar3,2,0x10);
        }
      }
      goto switchD_004c9d5a_caseD_3;
    case 1:
      uVar8 = *(undefined1 *)(*(long *)(_o + 8) + 0x110);
      break;
    case 2:
      uVar8 = *(undefined1 *)(*(long *)(_o + 8) + 0x111);
      break;
    case 3:
      iVar9 = cursorWidth((QWidgetTextControl *)_o);
      goto LAB_004c9fb0;
    case 4:
      iVar9 = *(int *)(*(long *)(_o + 8) + 0xb0);
LAB_004c9fb0:
      *piVar2 = iVar9;
      goto switchD_004c9d5a_caseD_3;
    case 5:
      uVar8 = *(undefined1 *)(*(long *)(_o + 8) + 0x192);
      break;
    case 6:
      uVar8 = *(undefined1 *)(*(long *)(_o + 8) + 0x191);
    }
    *(undefined1 *)piVar2 = uVar8;
    goto switchD_004c9d5a_caseD_3;
  case WriteProperty:
    if (6 < (uint)_id) goto switchD_004c9d5a_caseD_3;
    pQVar13 = (QString *)*_a;
    switch(_id) {
    case 0:
      pQVar15 = *(QWidgetTextControlPrivate **)(_o + 8);
      if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
        TVar14 = RichText;
        goto LAB_004c9ddd;
      }
      goto LAB_004ca706;
    case 1:
      *(undefined1 *)(*(long *)(_o + 8) + 0x110) = *(undefined1 *)&(pQVar13->d).d;
      break;
    case 2:
      *(undefined1 *)(*(long *)(_o + 8) + 0x111) = *(undefined1 *)&(pQVar13->d).d;
      break;
    case 3:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
        setCursorWidth((QWidgetTextControl *)_o,*(int *)&(pQVar13->d).d);
        return;
      }
      goto LAB_004ca706;
    case 4:
      uVar1 = *(uint *)&(pQVar13->d).d;
      pQVar15 = *(QWidgetTextControlPrivate **)(_o + 8);
      if (((pQVar15->interactionFlags).super_QFlagsStorageHelper<Qt::TextInteractionFlag,_4>.
           super_QFlagsStorage<Qt::TextInteractionFlag>.i != uVar1) &&
         ((pQVar15->interactionFlags).super_QFlagsStorageHelper<Qt::TextInteractionFlag,_4>.
          super_QFlagsStorage<Qt::TextInteractionFlag>.i = uVar1, pQVar15->hasFocus == true)) {
        if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
          QWidgetTextControlPrivate::setCursorVisible(pQVar15,SUB41((uVar1 & 0x10) >> 4,0));
          return;
        }
        goto LAB_004ca706;
      }
      break;
    case 5:
      *(undefined1 *)(*(long *)(_o + 8) + 0x192) = *(undefined1 *)&(pQVar13->d).d;
      break;
    case 6:
      *(undefined1 *)(*(long *)(_o + 8) + 0x191) = *(undefined1 *)&(pQVar13->d).d;
    }
  default:
    goto switchD_004c9d5a_caseD_3;
  case IndexOfMethod:
    pcVar6 = *_a[1];
    lVar7 = *(long *)((long)_a[1] + 8);
    if (pcVar6 == textChanged && lVar7 == 0) {
      *(undefined4 *)*_a = 0;
    }
    else if (pcVar6 == undoAvailable && lVar7 == 0) {
      *(undefined4 *)*_a = 1;
    }
    else if (pcVar6 == redoAvailable && lVar7 == 0) {
      *(undefined4 *)*_a = 2;
    }
    else if (pcVar6 == currentCharFormatChanged && lVar7 == 0) {
      *(undefined4 *)*_a = 3;
    }
    else if (pcVar6 == copyAvailable && lVar7 == 0) {
      *(undefined4 *)*_a = 4;
    }
    else if (pcVar6 == selectionChanged && lVar7 == 0) {
      *(undefined4 *)*_a = 5;
    }
    else if (pcVar6 == cursorPositionChanged && lVar7 == 0) {
      *(undefined4 *)*_a = 6;
    }
    else if (pcVar6 == updateRequest && lVar7 == 0) {
      *(undefined4 *)*_a = 7;
    }
    else if (pcVar6 == documentSizeChanged && lVar7 == 0) {
      *(undefined4 *)*_a = 9;
    }
    else if (pcVar6 == blockCountChanged && lVar7 == 0) {
      *(undefined4 *)*_a = 10;
    }
    else if (pcVar6 == visibilityRequest && lVar7 == 0) {
      *(undefined4 *)*_a = 0xb;
    }
    else if (pcVar6 == microFocusChanged && lVar7 == 0) {
      *(undefined4 *)*_a = 0xc;
    }
    else if (pcVar6 == linkActivated && lVar7 == 0) {
      *(undefined4 *)*_a = 0xd;
    }
    else if (pcVar6 == linkHovered && lVar7 == 0) {
      *(undefined4 *)*_a = 0xe;
    }
    else if (pcVar6 == blockMarkerHovered && lVar7 == 0) {
      *(undefined4 *)*_a = 0xf;
    }
    else if (pcVar6 == modificationChanged && lVar7 == 0) {
      *(undefined4 *)*_a = 0x10;
    }
    goto switchD_004c9d5a_caseD_3;
  }
  switch(_id) {
  case 0:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
      iVar9 = 0;
LAB_004ca402:
      QMetaObject::activate(_o,&staticMetaObject,iVar9,(void **)0x0);
      return;
    }
    break;
  case 1:
    local_48._8_8_ = local_28;
    local_28[0]._0_4_ = CONCAT31(local_28[0]._1_3_,*_a[1]);
    local_48.shared = (PrivateShared *)0x0;
    iVar9 = 1;
    goto LAB_004ca48e;
  case 2:
    local_48._8_8_ = local_28;
    local_28[0]._0_4_ = CONCAT31(local_28[0]._1_3_,*_a[1]);
    local_48.shared = (PrivateShared *)0x0;
    iVar9 = 2;
    paVar12 = &local_48;
    goto LAB_004ca48e;
  case 3:
    local_48._8_8_ = _a[1];
    local_48.shared = (PrivateShared *)0x0;
    iVar9 = 3;
    paVar12 = &local_48;
    goto LAB_004ca48e;
  case 4:
    local_48._8_8_ = local_28;
    local_28[0]._0_4_ = CONCAT31(local_28[0]._1_3_,*_a[1]);
    local_48.shared = (PrivateShared *)0x0;
    iVar9 = 4;
    paVar12 = &local_48;
    goto LAB_004ca48e;
  case 5:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
      iVar9 = 5;
      goto LAB_004ca402;
    }
    break;
  case 6:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
      iVar9 = 6;
      goto LAB_004ca402;
    }
    break;
  case 7:
    paVar10 = (anon_union_24_3_e3d07ef4_for_data *)_a[1];
    goto LAB_004ca474;
  case 8:
    local_48._16_8_ = (undefined1 *)0x0;
    puStack_30 = (undefined1 *)0x0;
    local_48.shared = (PrivateShared *)0x0;
    local_48._8_8_ = (void **)0x0;
    paVar11 = (anon_union_24_3_e3d07ef4_for_data *)local_28;
LAB_004ca474:
    paVar11->shared = (PrivateShared *)0x0;
    *(anon_union_24_3_e3d07ef4_for_data **)((long)paVar11->data + 8) = paVar10;
    iVar9 = 7;
    paVar12 = paVar11;
    goto LAB_004ca48e;
  case 9:
    local_48._8_8_ = _a[1];
    local_48.shared = (PrivateShared *)0x0;
    iVar9 = 9;
    paVar12 = &local_48;
    goto LAB_004ca48e;
  case 10:
    local_28[0]._0_4_ = *_a[1];
    local_48._8_8_ = local_28;
    local_48.shared = (PrivateShared *)0x0;
    iVar9 = 10;
    paVar12 = &local_48;
    goto LAB_004ca48e;
  case 0xb:
    local_48._8_8_ = _a[1];
    local_48.shared = (PrivateShared *)0x0;
    iVar9 = 0xb;
    paVar12 = &local_48;
    goto LAB_004ca48e;
  case 0xc:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
      iVar9 = 0xc;
      goto LAB_004ca402;
    }
    break;
  case 0xd:
    local_48._8_8_ = _a[1];
    local_48.shared = (PrivateShared *)0x0;
    iVar9 = 0xd;
    paVar12 = &local_48;
    goto LAB_004ca48e;
  case 0xe:
    local_48._8_8_ = _a[1];
    local_48.shared = (PrivateShared *)0x0;
    iVar9 = 0xe;
    paVar12 = &local_48;
    goto LAB_004ca48e;
  case 0xf:
    local_48._8_8_ = _a[1];
    local_48.shared = (PrivateShared *)0x0;
    iVar9 = 0xf;
    paVar12 = &local_48;
    goto LAB_004ca48e;
  case 0x10:
    local_48._8_8_ = local_28;
    local_28[0]._0_4_ = CONCAT31(local_28[0]._1_3_,*_a[1]);
    local_48.shared = (PrivateShared *)0x0;
    iVar9 = 0x10;
    paVar12 = &local_48;
LAB_004ca48e:
    QMetaObject::activate(_o,&staticMetaObject,iVar9,&paVar12->shared);
switchD_004c9d5a_caseD_3:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
      return;
    }
    break;
  case 0x11:
    pQVar13 = (QString *)_a[1];
    pQVar15 = *(QWidgetTextControlPrivate **)(_o + 8);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
      TVar14 = PlainText;
LAB_004c9ddd:
      QWidgetTextControlPrivate::setContent(pQVar15,TVar14,pQVar13,(QTextDocument *)0x0);
      return;
    }
    break;
  case 0x12:
    pQVar13 = (QString *)_a[1];
    pQVar15 = *(QWidgetTextControlPrivate **)(_o + 8);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
      TVar14 = MarkdownText;
      goto LAB_004c9ddd;
    }
    break;
  case 0x13:
    pQVar13 = (QString *)_a[1];
    pQVar15 = *(QWidgetTextControlPrivate **)(_o + 8);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
      TVar14 = RichText;
      goto LAB_004c9ddd;
    }
    break;
  case 0x14:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
      cut((QWidgetTextControl *)_o);
      return;
    }
    break;
  case 0x15:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
      copy((QWidgetTextControl *)_o,(EVP_PKEY_CTX *)CONCAT44(in_register_00000034,_c),
           (EVP_PKEY_CTX *)CONCAT44(in_register_00000014,_id));
      return;
    }
    break;
  case 0x16:
    mode = *_a[1];
    if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
LAB_004ca55a:
      paste((QWidgetTextControl *)_o,mode);
      return;
    }
    break;
  case 0x17:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
      mode = Clipboard;
      goto LAB_004ca55a;
    }
    break;
  case 0x18:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
      undo((QWidgetTextControl *)_o);
      return;
    }
    break;
  case 0x19:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
      redo((QWidgetTextControl *)_o);
      return;
    }
    break;
  case 0x1a:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
      clear((QWidgetTextControl *)_o);
      return;
    }
    break;
  case 0x1b:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
      selectAll((QWidgetTextControl *)_o);
      return;
    }
    break;
  case 0x1c:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
      QTextCursor::insertText((QString *)(*(long *)(_o + 8) + 0x88));
      return;
    }
    break;
  case 0x1d:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
      QTextCursor::insertHtml((QString *)(*(long *)(_o + 8) + 0x88));
      return;
    }
    break;
  case 0x1e:
    pQVar13 = (QString *)_a[1];
    pQVar15 = *(QWidgetTextControlPrivate **)(_o + 8);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
      TVar14 = AutoText;
LAB_004ca4f0:
      QWidgetTextControlPrivate::append(pQVar15,pQVar13,TVar14);
      return;
    }
    break;
  case 0x1f:
    pQVar13 = (QString *)_a[1];
    pQVar15 = *(QWidgetTextControlPrivate **)(_o + 8);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
      TVar14 = RichText;
      goto LAB_004ca4f0;
    }
    break;
  case 0x20:
    pQVar13 = (QString *)_a[1];
    pQVar15 = *(QWidgetTextControlPrivate **)(_o + 8);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
      TVar14 = PlainText;
      goto LAB_004ca4f0;
    }
    break;
  case 0x21:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
      QTextDocument::adjustSize();
      return;
    }
    break;
  case 0x22:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
      QWidgetTextControlPrivate::_q_deleteSelected(*(QWidgetTextControlPrivate **)(_o + 8));
      return;
    }
    break;
  case 0x23:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
      QWidgetTextControlPrivate::_q_copyLink(*(QWidgetTextControlPrivate **)(_o + 8));
      return;
    }
    break;
  case 0x24:
    local_48._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
    puStack_30 = &DAT_aaaaaaaaaaaaaaaa;
    local_48.shared = (PrivateShared *)&DAT_aaaaaaaaaaaaaaaa;
    local_48._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    (**(code **)(*(long *)_o + 0x68))(&local_48,_o,*_a[1],_a[2]);
    if ((QVariant *)*_a != (QVariant *)0x0) {
      ::QVariant::operator=((QVariant *)*_a,(QVariant *)&local_48);
    }
    ::QVariant::~QVariant((QVariant *)&local_48);
  default:
    goto switchD_004c9d5a_caseD_3;
  }
LAB_004ca706:
  __stack_chk_fail();
}

Assistant:

void QWidgetTextControl::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QWidgetTextControl *>(_o);
    if (_c == QMetaObject::InvokeMetaMethod) {
        switch (_id) {
        case 0: _t->textChanged(); break;
        case 1: _t->undoAvailable((*reinterpret_cast< std::add_pointer_t<bool>>(_a[1]))); break;
        case 2: _t->redoAvailable((*reinterpret_cast< std::add_pointer_t<bool>>(_a[1]))); break;
        case 3: _t->currentCharFormatChanged((*reinterpret_cast< std::add_pointer_t<QTextCharFormat>>(_a[1]))); break;
        case 4: _t->copyAvailable((*reinterpret_cast< std::add_pointer_t<bool>>(_a[1]))); break;
        case 5: _t->selectionChanged(); break;
        case 6: _t->cursorPositionChanged(); break;
        case 7: _t->updateRequest((*reinterpret_cast< std::add_pointer_t<QRectF>>(_a[1]))); break;
        case 8: _t->updateRequest(); break;
        case 9: _t->documentSizeChanged((*reinterpret_cast< std::add_pointer_t<QSizeF>>(_a[1]))); break;
        case 10: _t->blockCountChanged((*reinterpret_cast< std::add_pointer_t<int>>(_a[1]))); break;
        case 11: _t->visibilityRequest((*reinterpret_cast< std::add_pointer_t<QRectF>>(_a[1]))); break;
        case 12: _t->microFocusChanged(); break;
        case 13: _t->linkActivated((*reinterpret_cast< std::add_pointer_t<QString>>(_a[1]))); break;
        case 14: _t->linkHovered((*reinterpret_cast< std::add_pointer_t<QString>>(_a[1]))); break;
        case 15: _t->blockMarkerHovered((*reinterpret_cast< std::add_pointer_t<QTextBlock>>(_a[1]))); break;
        case 16: _t->modificationChanged((*reinterpret_cast< std::add_pointer_t<bool>>(_a[1]))); break;
        case 17: _t->setPlainText((*reinterpret_cast< std::add_pointer_t<QString>>(_a[1]))); break;
        case 18: _t->setMarkdown((*reinterpret_cast< std::add_pointer_t<QString>>(_a[1]))); break;
        case 19: _t->setHtml((*reinterpret_cast< std::add_pointer_t<QString>>(_a[1]))); break;
        case 20: _t->cut(); break;
        case 21: _t->copy(); break;
        case 22: _t->paste((*reinterpret_cast< std::add_pointer_t<QClipboard::Mode>>(_a[1]))); break;
        case 23: _t->paste(); break;
        case 24: _t->undo(); break;
        case 25: _t->redo(); break;
        case 26: _t->clear(); break;
        case 27: _t->selectAll(); break;
        case 28: _t->insertPlainText((*reinterpret_cast< std::add_pointer_t<QString>>(_a[1]))); break;
        case 29: _t->insertHtml((*reinterpret_cast< std::add_pointer_t<QString>>(_a[1]))); break;
        case 30: _t->append((*reinterpret_cast< std::add_pointer_t<QString>>(_a[1]))); break;
        case 31: _t->appendHtml((*reinterpret_cast< std::add_pointer_t<QString>>(_a[1]))); break;
        case 32: _t->appendPlainText((*reinterpret_cast< std::add_pointer_t<QString>>(_a[1]))); break;
        case 33: _t->adjustSize(); break;
        case 34: _t->d_func()->_q_deleteSelected(); break;
        case 35: _t->d_func()->_q_copyLink(); break;
        case 36: { QVariant _r = _t->loadResource((*reinterpret_cast< std::add_pointer_t<int>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<QUrl>>(_a[2])));
            if (_a[0]) *reinterpret_cast< QVariant*>(_a[0]) = std::move(_r); }  break;
        default: ;
        }
    }
    if (_c == QMetaObject::IndexOfMethod) {
        if (QtMocHelpers::indexOfMethod<void (QWidgetTextControl::*)()>(_a, &QWidgetTextControl::textChanged, 0))
            return;
        if (QtMocHelpers::indexOfMethod<void (QWidgetTextControl::*)(bool )>(_a, &QWidgetTextControl::undoAvailable, 1))
            return;
        if (QtMocHelpers::indexOfMethod<void (QWidgetTextControl::*)(bool )>(_a, &QWidgetTextControl::redoAvailable, 2))
            return;
        if (QtMocHelpers::indexOfMethod<void (QWidgetTextControl::*)(const QTextCharFormat & )>(_a, &QWidgetTextControl::currentCharFormatChanged, 3))
            return;
        if (QtMocHelpers::indexOfMethod<void (QWidgetTextControl::*)(bool )>(_a, &QWidgetTextControl::copyAvailable, 4))
            return;
        if (QtMocHelpers::indexOfMethod<void (QWidgetTextControl::*)()>(_a, &QWidgetTextControl::selectionChanged, 5))
            return;
        if (QtMocHelpers::indexOfMethod<void (QWidgetTextControl::*)()>(_a, &QWidgetTextControl::cursorPositionChanged, 6))
            return;
        if (QtMocHelpers::indexOfMethod<void (QWidgetTextControl::*)(const QRectF & )>(_a, &QWidgetTextControl::updateRequest, 7))
            return;
        if (QtMocHelpers::indexOfMethod<void (QWidgetTextControl::*)(const QSizeF & )>(_a, &QWidgetTextControl::documentSizeChanged, 9))
            return;
        if (QtMocHelpers::indexOfMethod<void (QWidgetTextControl::*)(int )>(_a, &QWidgetTextControl::blockCountChanged, 10))
            return;
        if (QtMocHelpers::indexOfMethod<void (QWidgetTextControl::*)(const QRectF & )>(_a, &QWidgetTextControl::visibilityRequest, 11))
            return;
        if (QtMocHelpers::indexOfMethod<void (QWidgetTextControl::*)()>(_a, &QWidgetTextControl::microFocusChanged, 12))
            return;
        if (QtMocHelpers::indexOfMethod<void (QWidgetTextControl::*)(const QString & )>(_a, &QWidgetTextControl::linkActivated, 13))
            return;
        if (QtMocHelpers::indexOfMethod<void (QWidgetTextControl::*)(const QString & )>(_a, &QWidgetTextControl::linkHovered, 14))
            return;
        if (QtMocHelpers::indexOfMethod<void (QWidgetTextControl::*)(const QTextBlock & )>(_a, &QWidgetTextControl::blockMarkerHovered, 15))
            return;
        if (QtMocHelpers::indexOfMethod<void (QWidgetTextControl::*)(bool )>(_a, &QWidgetTextControl::modificationChanged, 16))
            return;
    }
    if (_c == QMetaObject::ReadProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: *reinterpret_cast<QString*>(_v) = _t->toHtml(); break;
        case 1: *reinterpret_cast<bool*>(_v) = _t->overwriteMode(); break;
        case 2: *reinterpret_cast<bool*>(_v) = _t->acceptRichText(); break;
        case 3: *reinterpret_cast<int*>(_v) = _t->cursorWidth(); break;
        case 4: *reinterpret_cast<Qt::TextInteractionFlags*>(_v) = _t->textInteractionFlags(); break;
        case 5: *reinterpret_cast<bool*>(_v) = _t->openExternalLinks(); break;
        case 6: *reinterpret_cast<bool*>(_v) = _t->ignoreUnusedNavigationEvents(); break;
        default: break;
        }
    }
    if (_c == QMetaObject::WriteProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: _t->setHtml(*reinterpret_cast<QString*>(_v)); break;
        case 1: _t->setOverwriteMode(*reinterpret_cast<bool*>(_v)); break;
        case 2: _t->setAcceptRichText(*reinterpret_cast<bool*>(_v)); break;
        case 3: _t->setCursorWidth(*reinterpret_cast<int*>(_v)); break;
        case 4: _t->setTextInteractionFlags(*reinterpret_cast<Qt::TextInteractionFlags*>(_v)); break;
        case 5: _t->setOpenExternalLinks(*reinterpret_cast<bool*>(_v)); break;
        case 6: _t->setIgnoreUnusedNavigationEvents(*reinterpret_cast<bool*>(_v)); break;
        default: break;
        }
    }
}